

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int getencoding(xmlattr_list *list)

{
  int iVar1;
  int local_1c;
  xmlattr *pxStack_18;
  enctype encoding;
  xmlattr *attr;
  xmlattr_list *list_local;
  
  local_1c = 0;
  for (pxStack_18 = list->first; pxStack_18 != (xmlattr *)0x0; pxStack_18 = pxStack_18->next) {
    iVar1 = strcmp(pxStack_18->name,"style");
    if (iVar1 == 0) {
      iVar1 = strcmp(pxStack_18->value,"application/octet-stream");
      if (iVar1 == 0) {
        local_1c = 0;
      }
      else {
        iVar1 = strcmp(pxStack_18->value,"application/x-gzip");
        if (iVar1 == 0) {
          local_1c = 1;
        }
        else {
          iVar1 = strcmp(pxStack_18->value,"application/x-bzip2");
          if (iVar1 == 0) {
            local_1c = 2;
          }
          else {
            iVar1 = strcmp(pxStack_18->value,"application/x-lzma");
            if (iVar1 == 0) {
              local_1c = 3;
            }
            else {
              iVar1 = strcmp(pxStack_18->value,"application/x-xz");
              if (iVar1 == 0) {
                local_1c = 4;
              }
            }
          }
        }
      }
    }
  }
  return local_1c;
}

Assistant:

static int
getencoding(struct xmlattr_list *list)
{
	struct xmlattr *attr;
	enum enctype encoding = NONE;

	for (attr = list->first; attr != NULL; attr = attr->next) {
		if (strcmp(attr->name, "style") == 0) {
			if (strcmp(attr->value, "application/octet-stream") == 0)
				encoding = NONE;
			else if (strcmp(attr->value, "application/x-gzip") == 0)
				encoding = GZIP;
			else if (strcmp(attr->value, "application/x-bzip2") == 0)
				encoding = BZIP2;
			else if (strcmp(attr->value, "application/x-lzma") == 0)
				encoding = LZMA;
			else if (strcmp(attr->value, "application/x-xz") == 0)
				encoding = XZ;
		}
	}
	return (encoding);
}